

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmExportFileGenerator.cxx
# Opt level: O1

void __thiscall
cmExportFileGenerator::GenerateTargetFileSets
          (cmExportFileGenerator *this,cmGeneratorTarget *gte,ostream *os,cmTargetExport *te)

{
  pointer pcVar1;
  char *pcVar2;
  cmMakefile *this_00;
  size_type sVar3;
  cmGeneratorTarget *pcVar4;
  ostream *poVar5;
  cmFileSet *pcVar6;
  string *psVar7;
  WrapQuotes wrapQuotes;
  cmTargetExport *in_R8;
  string *name;
  initializer_list<std::basic_string_view<char,_std::char_traits<char>_>_> views;
  initializer_list<std::basic_string_view<char,_std::char_traits<char>_>_> views_00;
  string_view str;
  string_view str_00;
  string targetName;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  interfaceFileSets;
  string local_138;
  cmGeneratorTarget *local_118;
  cmExportFileGenerator *local_110;
  long *local_108;
  long local_100;
  long local_f8 [2];
  long *local_e8;
  long local_e0;
  long local_d8 [2];
  string local_c8;
  string local_a8;
  undefined8 local_88;
  char *local_80;
  size_type local_78;
  pointer local_70;
  undefined8 local_68;
  char *local_60;
  ostream *local_58;
  string *local_50;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  local_48;
  
  cmTarget::GetAllInterfaceFileSets_abi_cxx11_(&local_48,gte->Target);
  if (local_48.
      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ._M_impl.super__Vector_impl_data._M_start !=
      local_48.
      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ._M_impl.super__Vector_impl_data._M_finish) {
    pcVar1 = (this->Namespace)._M_dataplus._M_p;
    pcVar2 = (char *)(this->Namespace)._M_string_length;
    cmGeneratorTarget::GetExportName_abi_cxx11_(&local_138,gte);
    local_a8.field_2._M_allocated_capacity = local_138._M_string_length;
    local_a8.field_2._8_8_ = local_138._M_dataplus._M_p;
    views._M_len = 2;
    views._M_array = (iterator)&local_a8;
    local_a8._M_dataplus._M_p = pcVar2;
    local_a8._M_string_length = (size_type)pcVar1;
    cmCatViews_abi_cxx11_(&local_c8,views);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_138._M_dataplus._M_p != &local_138.field_2) {
      operator_delete(local_138._M_dataplus._M_p,local_138.field_2._M_allocated_capacity + 1);
    }
    local_110 = this;
    std::__ostream_insert<char,std::char_traits<char>>
              (os,"if(NOT CMAKE_VERSION VERSION_LESS \"3.23.0\")\n  target_sources(",0x3d);
    poVar5 = std::__ostream_insert<char,std::char_traits<char>>
                       (os,local_c8._M_dataplus._M_p,local_c8._M_string_length);
    std::__ostream_insert<char,std::char_traits<char>>(poVar5,"\n",1);
    local_50 = local_48.
               super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               ._M_impl.super__Vector_impl_data._M_finish;
    name = local_48.
           super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           ._M_impl.super__Vector_impl_data._M_start;
    pcVar4 = gte;
    poVar5 = os;
    if (local_48.
        super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ._M_impl.super__Vector_impl_data._M_start !=
        local_48.
        super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ._M_impl.super__Vector_impl_data._M_finish) {
      do {
        local_58 = poVar5;
        local_118 = pcVar4;
        pcVar6 = cmTarget::GetFileSet(local_118->Target,name);
        wrapQuotes = (WrapQuotes)in_R8;
        if (pcVar6 == (cmFileSet *)0x0) {
          this_00 = local_118->Makefile;
          pcVar1 = (name->_M_dataplus)._M_p;
          sVar3 = name->_M_string_length;
          psVar7 = cmGeneratorTarget::GetName_abi_cxx11_(local_118);
          local_a8._M_dataplus._M_p = (char *)0xa;
          local_a8._M_string_length = 0x6b3d42;
          local_88 = 0x26;
          local_80 = "\" is listed in interface file sets of ";
          local_70 = (psVar7->_M_dataplus)._M_p;
          local_78 = psVar7->_M_string_length;
          local_68 = 0x19;
          local_60 = " but has not been created";
          views_00._M_len = 5;
          views_00._M_array = (iterator)&local_a8;
          local_a8.field_2._M_allocated_capacity = sVar3;
          local_a8.field_2._8_8_ = pcVar1;
          cmCatViews_abi_cxx11_(&local_138,views_00);
          cmMakefile::IssueMessage(this_00,FATAL_ERROR,&local_138);
          os = local_58;
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_138._M_dataplus._M_p != &local_138.field_2) {
            operator_delete(local_138._M_dataplus._M_p,local_138.field_2._M_allocated_capacity + 1);
            os = local_58;
          }
        }
        else {
          std::__ostream_insert<char,std::char_traits<char>>(os,"    INTERFACE",0xd);
          std::__ostream_insert<char,std::char_traits<char>>(os,"\n      FILE_SET ",0x10);
          str._M_str = (char *)0x0;
          str._M_len = (size_t)(name->_M_dataplus)._M_p;
          cmOutputConverter::EscapeForCMake_abi_cxx11_
                    (&local_a8,(cmOutputConverter *)name->_M_string_length,str,wrapQuotes);
          poVar5 = std::__ostream_insert<char,std::char_traits<char>>
                             (os,local_a8._M_dataplus._M_p,local_a8._M_string_length);
          std::__ostream_insert<char,std::char_traits<char>>(poVar5,"\n      TYPE ",0xc);
          str_00._M_str = (char *)0x0;
          str_00._M_len = (size_t)(pcVar6->Type)._M_dataplus._M_p;
          cmOutputConverter::EscapeForCMake_abi_cxx11_
                    (&local_138,(cmOutputConverter *)(pcVar6->Type)._M_string_length,str_00,
                     wrapQuotes);
          poVar5 = std::__ostream_insert<char,std::char_traits<char>>
                             (poVar5,local_138._M_dataplus._M_p,local_138._M_string_length);
          std::__ostream_insert<char,std::char_traits<char>>(poVar5,"\n      BASE_DIRS ",0x11);
          (*local_110->_vptr_cmExportFileGenerator[0x11])(&local_e8,local_110,local_118,pcVar6,te);
          poVar5 = std::__ostream_insert<char,std::char_traits<char>>
                             (poVar5,(char *)local_e8,local_e0);
          std::__ostream_insert<char,std::char_traits<char>>(poVar5,"\n      FILES ",0xd);
          in_R8 = te;
          (*local_110->_vptr_cmExportFileGenerator[0x12])(&local_108,local_110,local_118);
          poVar5 = std::__ostream_insert<char,std::char_traits<char>>
                             (poVar5,(char *)local_108,local_100);
          std::__ostream_insert<char,std::char_traits<char>>(poVar5,"\n",1);
          if (local_108 != local_f8) {
            operator_delete(local_108,local_f8[0] + 1);
          }
          if (local_e8 != local_d8) {
            operator_delete(local_e8,local_d8[0] + 1);
          }
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_138._M_dataplus._M_p != &local_138.field_2) {
            operator_delete(local_138._M_dataplus._M_p,local_138.field_2._M_allocated_capacity + 1);
          }
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_a8._M_dataplus._M_p != &local_a8.field_2) {
            operator_delete(local_a8._M_dataplus._M_p,local_a8.field_2._M_allocated_capacity + 1);
          }
        }
        if (pcVar6 == (cmFileSet *)0x0) goto LAB_00303f27;
        name = name + 1;
        pcVar4 = local_118;
        poVar5 = local_58;
      } while (name != local_50);
    }
    std::__ostream_insert<char,std::char_traits<char>>(os,"  )\nendif()\n\n",0xd);
LAB_00303f27:
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_c8._M_dataplus._M_p != &local_c8.field_2) {
      operator_delete(local_c8._M_dataplus._M_p,local_c8.field_2._M_allocated_capacity + 1);
    }
  }
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector(&local_48);
  return;
}

Assistant:

void cmExportFileGenerator::GenerateTargetFileSets(cmGeneratorTarget* gte,
                                                   std::ostream& os,
                                                   cmTargetExport* te)
{
  auto interfaceFileSets = gte->Target->GetAllInterfaceFileSets();
  if (!interfaceFileSets.empty()) {
    std::string targetName = cmStrCat(this->Namespace, gte->GetExportName());
    os << "if(NOT CMAKE_VERSION VERSION_LESS \"3.23.0\")\n"
          "  target_sources("
       << targetName << "\n";

    for (auto const& name : interfaceFileSets) {
      auto* fileSet = gte->Target->GetFileSet(name);
      if (!fileSet) {
        gte->Makefile->IssueMessage(
          MessageType::FATAL_ERROR,
          cmStrCat("File set \"", name,
                   "\" is listed in interface file sets of ", gte->GetName(),
                   " but has not been created"));
        return;
      }

      os << "    INTERFACE"
         << "\n      FILE_SET " << cmOutputConverter::EscapeForCMake(name)
         << "\n      TYPE "
         << cmOutputConverter::EscapeForCMake(fileSet->GetType())
         << "\n      BASE_DIRS "
         << this->GetFileSetDirectories(gte, fileSet, te) << "\n      FILES "
         << this->GetFileSetFiles(gte, fileSet, te) << "\n";
    }

    os << "  )\nendif()\n\n";
  }
}